

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_280db::ArenaTest_FuzzFuseFreeAllocatorRace_Test::TestBody
          (ArenaTest_FuzzFuseFreeAllocatorRace_Test *this)

{
  bool bVar1;
  bool bVar2;
  upb_Arena *puVar3;
  reference ppuVar4;
  size_type sVar5;
  reference pvVar6;
  Time TVar7;
  Duration rhs;
  Time lhs;
  thread *t;
  iterator __end1;
  iterator __begin1;
  vector<std::thread,_std::allocator<std::thread>_> *__range1;
  upb_Arena *read;
  ulong local_198;
  size_t arenaCtr;
  uint32_t local_188;
  Time end;
  size_t tid;
  size_t i_1;
  size_t j;
  array<upb_Arena_*,_11UL> arr;
  size_t i;
  vector<std::array<upb_Arena_*,_11UL>,_std::allocator<std::array<upb_Arena_*,_11UL>_>_> arenas;
  size_t thread_count;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  undefined1 local_40 [8];
  Notification done;
  undefined1 local_28 [8];
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_upb_mem_arena_test_cc:512:40)>
  reset_max_block_size;
  upb_alloc_func *old;
  ArenaTest_FuzzFuseFreeAllocatorRace_Test *this_local;
  
  upb_Arena_SetMaxBlockSize(0x80);
  done._8_8_ = upb_alloc_global;
  reset_max_block_size.storage_.callback_buffer_ = (char  [8])upb_alloc_global.func;
  upb_alloc_global.func = checking_global_allocfunc;
  absl::lts_20250127::
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/arena_test.cc:512:40)>
  ::Cleanup((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_upb_mem_arena_test_cc:512:40)>
             *)local_28,(anon_class_8_1_ba1d6987)done._8_8_);
  absl::lts_20250127::Notification::Notification((Notification *)local_40);
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)&thread_count);
  arenas.
  super__Vector_base<std::array<upb_Arena_*,_11UL>,_std::allocator<std::array<upb_Arena_*,_11UL>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0xa;
  std::vector<std::array<upb_Arena_*,_11UL>,_std::allocator<std::array<upb_Arena_*,_11UL>_>_>::
  vector((vector<std::array<upb_Arena_*,_11UL>,_std::allocator<std::array<upb_Arena_*,_11UL>_>_> *)
         &i);
  for (arr._M_elems[10] = (upb_Arena *)0x0; arr._M_elems[10] < (upb_Arena *)0x2710;
      arr._M_elems[10] =
           (upb_Arena *)((long)&arr._M_elems[10]->ptr_dont_copy_me__upb_internal_use_only + 1)) {
    puVar3 = upb_Arena_New();
    ppuVar4 = std::array<upb_Arena_*,_11UL>::operator[]((array<upb_Arena_*,_11UL> *)&j,0);
    *ppuVar4 = puVar3;
    for (i_1 = 1; i_1 < (undefined1 *)
                        ((long)(arenas.
                                super__Vector_base<std::array<upb_Arena_*,_11UL>,_std::allocator<std::array<upb_Arena_*,_11UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_elems + 1U);
        i_1 = i_1 + 1) {
      puVar3 = upb_Arena_New();
      ppuVar4 = std::array<upb_Arena_*,_11UL>::operator[]((array<upb_Arena_*,_11UL> *)&j,i_1);
      *ppuVar4 = puVar3;
      ppuVar4 = std::array<upb_Arena_*,_11UL>::operator[]((array<upb_Arena_*,_11UL> *)&j,i_1 - 1);
      puVar3 = *ppuVar4;
      ppuVar4 = std::array<upb_Arena_*,_11UL>::operator[]((array<upb_Arena_*,_11UL> *)&j,i_1);
      upb_Arena_Fuse(puVar3,*ppuVar4);
    }
    std::vector<std::array<upb_Arena_*,_11UL>,_std::allocator<std::array<upb_Arena_*,_11UL>_>_>::
    push_back((vector<std::array<upb_Arena_*,_11UL>,_std::allocator<std::array<upb_Arena_*,_11UL>_>_>
               *)&i,(value_type *)&j);
  }
  for (tid = 0; tid < arenas.
                      super__Vector_base<std::array<upb_Arena_*,_11UL>,_std::allocator<std::array<upb_Arena_*,_11UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage; tid = tid + 1) {
    end.rep_.rep_hi_.hi_ = (undefined4)tid;
    end.rep_.rep_lo_ = tid._4_4_;
    std::vector<std::thread,std::allocator<std::thread>>::
    emplace_back<(anonymous_namespace)::ArenaTest_FuzzFuseFreeAllocatorRace_Test::TestBody()::__1>
              ((vector<std::thread,std::allocator<std::thread>> *)&thread_count,
               (type *)&end.rep_.rep_hi_.hi_);
  }
  TVar7 = absl::lts_20250127::Now();
  rhs = absl::lts_20250127::Seconds<int,_0>(2);
  TVar7 = absl::lts_20250127::operator+(TVar7,rhs);
  arenaCtr = (size_t)TVar7.rep_.rep_hi_;
  local_188 = TVar7.rep_.rep_lo_;
  end.rep_.rep_hi_.lo_ = local_188;
  local_198 = 0;
  while( true ) {
    lhs = absl::lts_20250127::Now();
    TVar7.rep_.rep_lo_ = end.rep_.rep_hi_.lo_;
    TVar7.rep_.rep_hi_.lo_ = (undefined4)arenaCtr;
    TVar7.rep_.rep_hi_.hi_ = arenaCtr._4_4_;
    bVar1 = absl::lts_20250127::operator<(lhs,TVar7);
    bVar2 = false;
    if (bVar1) {
      sVar5 = std::
              vector<std::array<upb_Arena_*,_11UL>,_std::allocator<std::array<upb_Arena_*,_11UL>_>_>
              ::size((vector<std::array<upb_Arena_*,_11UL>,_std::allocator<std::array<upb_Arena_*,_11UL>_>_>
                      *)&i);
      bVar2 = local_198 < sVar5;
    }
    if (!bVar2) break;
    pvVar6 = std::
             vector<std::array<upb_Arena_*,_11UL>,_std::allocator<std::array<upb_Arena_*,_11UL>_>_>
             ::operator[]((vector<std::array<upb_Arena_*,_11UL>,_std::allocator<std::array<upb_Arena_*,_11UL>_>_>
                           *)&i,local_198);
    ppuVar4 = std::array<upb_Arena_*,_11UL>::operator[]
                        (pvVar6,(size_type)
                                arenas.
                                super__Vector_base<std::array<upb_Arena_*,_11UL>,_std::allocator<std::array<upb_Arena_*,_11UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    puVar3 = *ppuVar4;
    ::upb_Arena_Malloc(puVar3,0x80);
    ::upb_Arena_Malloc(puVar3,0x80);
    upb_Arena_Free(puVar3);
    local_198 = local_198 + 1;
  }
  absl::lts_20250127::Notification::Notify((Notification *)local_40);
  while (sVar5 = std::
                 vector<std::array<upb_Arena_*,_11UL>,_std::allocator<std::array<upb_Arena_*,_11UL>_>_>
                 ::size((vector<std::array<upb_Arena_*,_11UL>,_std::allocator<std::array<upb_Arena_*,_11UL>_>_>
                         *)&i), local_198 < sVar5) {
    pvVar6 = std::
             vector<std::array<upb_Arena_*,_11UL>,_std::allocator<std::array<upb_Arena_*,_11UL>_>_>
             ::operator[]((vector<std::array<upb_Arena_*,_11UL>,_std::allocator<std::array<upb_Arena_*,_11UL>_>_>
                           *)&i,local_198);
    ppuVar4 = std::array<upb_Arena_*,_11UL>::operator[]
                        (pvVar6,(size_type)
                                arenas.
                                super__Vector_base<std::array<upb_Arena_*,_11UL>,_std::allocator<std::array<upb_Arena_*,_11UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    upb_Arena_Free(*ppuVar4);
    local_198 = local_198 + 1;
  }
  __end1 = std::vector<std::thread,_std::allocator<std::thread>_>::begin
                     ((vector<std::thread,_std::allocator<std::thread>_> *)&thread_count);
  t = (thread *)
      std::vector<std::thread,_std::allocator<std::thread>_>::end
                ((vector<std::thread,_std::allocator<std::thread>_> *)&thread_count);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                                     *)&t), bVar2) {
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator*(&__end1);
    std::thread::join();
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator++(&__end1);
  }
  std::vector<std::array<upb_Arena_*,_11UL>,_std::allocator<std::array<upb_Arena_*,_11UL>_>_>::
  ~vector((vector<std::array<upb_Arena_*,_11UL>,_std::allocator<std::array<upb_Arena_*,_11UL>_>_> *)
          &i);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)&thread_count);
  absl::lts_20250127::Notification::~Notification((Notification *)local_40);
  absl::lts_20250127::
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/arena_test.cc:512:40)>
  ::~Cleanup((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_upb_mem_arena_test_cc:512:40)>
              *)local_28);
  return;
}

Assistant:

TEST(ArenaTest, FuzzFuseFreeAllocatorRace) {
  upb_Arena_SetMaxBlockSize(128);
  upb_alloc_func* old = upb_alloc_global.func;
  upb_alloc_global.func = checking_global_allocfunc;
  absl::Cleanup reset_max_block_size = [old] {
    upb_Arena_SetMaxBlockSize(UPB_PRIVATE(kUpbDefaultMaxBlockSize));
    upb_alloc_global.func = old;
  };
  absl::Notification done;
  std::vector<std::thread> threads;
  size_t thread_count = 10;
  std::vector<std::array<upb_Arena*, 11>> arenas;
  for (size_t i = 0; i < 10000; ++i) {
    std::array<upb_Arena*, 11> arr;
    arr[0] = upb_Arena_New();
    for (size_t j = 1; j < thread_count + 1; ++j) {
      arr[j] = upb_Arena_New();
      upb_Arena_Fuse(arr[j - 1], arr[j]);
    }
    arenas.push_back(arr);
  }
  for (size_t i = 0; i < thread_count; ++i) {
    size_t tid = i;
    threads.emplace_back([&, tid]() {
      size_t arenaCtr = 0;
      while (!done.HasBeenNotified() && arenaCtr < arenas.size()) {
        upb_Arena* read = arenas[arenaCtr++][tid];
        (void)upb_Arena_Malloc(read, 128);
        (void)upb_Arena_Malloc(read, 128);
        upb_Arena_Free(read);
      }
      while (arenaCtr < arenas.size()) {
        upb_Arena_Free(arenas[arenaCtr++][tid]);
      }
    });
  }
  auto end = absl::Now() + absl::Seconds(2);
  size_t arenaCtr = 0;
  while (absl::Now() < end && arenaCtr < arenas.size()) {
    upb_Arena* read = arenas[arenaCtr++][thread_count];
    (void)upb_Arena_Malloc(read, 128);
    (void)upb_Arena_Malloc(read, 128);
    upb_Arena_Free(read);
  }
  done.Notify();
  while (arenaCtr < arenas.size()) {
    upb_Arena_Free(arenas[arenaCtr++][thread_count]);
  }
  for (auto& t : threads) t.join();
}